

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O3

png_charp png_format_number(png_const_charp start,png_charp end,int format,png_alloc_size_t number)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  png_charp pcVar4;
  ulong uVar5;
  int iVar6;
  
  end[-1] = '\0';
  pcVar4 = end + -1;
  if (start < pcVar4) {
    iVar6 = 1;
    bVar1 = false;
    iVar3 = 0;
    do {
      if (iVar6 <= iVar3 && number == 0) {
        return pcVar4;
      }
      switch(format) {
      case 2:
        iVar6 = 2;
      case 1:
        uVar5 = number / 10;
        pcVar4[-1] = "0123456789ABCDEF"[number % 10];
        break;
      case 4:
        iVar6 = 2;
      case 3:
        pcVar4[-1] = "0123456789ABCDEF"[(uint)number & 0xf];
        uVar5 = number >> 4;
        break;
      case 5:
        lVar2 = number + (number / 5 & 0xfffffffffffffffe) * -5;
        if ((bVar1) || (bVar1 = false, lVar2 != 0)) {
          pcVar4[-1] = "0123456789ABCDEF"[lVar2];
          pcVar4 = pcVar4 + -1;
          bVar1 = true;
        }
        uVar5 = number / 10;
        iVar6 = 5;
        goto LAB_001121c0;
      default:
        uVar5 = 0;
LAB_001121c0:
        iVar3 = iVar3 + 1;
        if (((format == 5) && (iVar3 == 5)) && (start < pcVar4)) {
          if (bVar1) {
            pcVar4[-1] = '.';
            pcVar4 = pcVar4 + -1;
            iVar3 = 5;
          }
          else {
            bVar1 = false;
            iVar3 = 5;
            if (uVar5 == 0) {
              pcVar4[-1] = '0';
              pcVar4 = pcVar4 + -1;
              bVar1 = false;
              uVar5 = 0;
            }
          }
        }
        goto LAB_001121b2;
      }
      pcVar4 = pcVar4 + -1;
      iVar3 = iVar3 + 1;
LAB_001121b2:
      number = uVar5;
    } while (start < pcVar4);
  }
  return pcVar4;
}

Assistant:

png_charp
png_format_number(png_const_charp start, png_charp end, int format,
    png_alloc_size_t number)
{
   int count = 0;    /* number of digits output */
   int mincount = 1; /* minimum number required */
   int output = 0;   /* digit output (for the fixed point format) */

   *--end = '\0';

   /* This is written so that the loop always runs at least once, even with
    * number zero.
    */
   while (end > start && (number != 0 || count < mincount))
   {

      static const char digits[] = "0123456789ABCDEF";

      switch (format)
      {
         case PNG_NUMBER_FORMAT_fixed:
            /* Needs five digits (the fraction) */
            mincount = 5;
            if (output != 0 || number % 10 != 0)
            {
               *--end = digits[number % 10];
               output = 1;
            }
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02u:
            /* Expects at least 2 digits. */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_u:
            *--end = digits[number % 10];
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02x:
            /* This format expects at least two digits */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_x:
            *--end = digits[number & 0xf];
            number >>= 4;
            break;

         default: /* an error */
            number = 0;
            break;
      }

      /* Keep track of the number of digits added */
      ++count;

      /* Float a fixed number here: */
      if ((format == PNG_NUMBER_FORMAT_fixed) && (count == 5) && (end > start))
      {
         /* End of the fraction, but maybe nothing was output?  In that case
          * drop the decimal point.  If the number is a true zero handle that
          * here.
          */
         if (output != 0)
            *--end = '.';
         else if (number == 0) /* and !output */
            *--end = '0';
      }
   }

   return end;
}